

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
exponential_search_upper_bound<int>
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int m,int *key)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  piVar1 = this->key_slots_;
  iVar4 = *key;
  if (iVar4 < piVar1[m]) {
    lVar3 = this->num_exp_search_iterations_;
    iVar2 = 1;
    while( true ) {
      lVar3 = lVar3 + 1;
      if ((m - iVar2 == 0 || m < iVar2) || (piVar1[m - iVar2] <= iVar4)) break;
      this->num_exp_search_iterations_ = lVar3;
      iVar2 = iVar2 * 2;
    }
    iVar4 = m;
    if (iVar2 < m) {
      iVar4 = iVar2;
    }
    iVar4 = m - iVar4;
    iVar2 = iVar2 / -2;
  }
  else {
    lVar3 = this->num_exp_search_iterations_;
    iVar5 = this->data_capacity_ - m;
    iVar2 = 1;
    while( true ) {
      lVar3 = lVar3 + 1;
      if ((iVar5 <= iVar2) || (iVar4 < piVar1[iVar2 + m])) break;
      this->num_exp_search_iterations_ = lVar3;
      iVar2 = iVar2 * 2;
    }
    iVar4 = iVar2 / 2 + m;
    if (iVar5 < iVar2) {
      iVar2 = iVar5;
    }
  }
  iVar4 = binary_search_upper_bound<int>(this,iVar4,iVar2 + m,key);
  return iVar4;
}

Assistant:

inline int exponential_search_upper_bound(int m, const K& key) {
    // Continue doubling the bound until it contains the upper bound. Then use
    // binary search.
    int bound = 1;
    int l, r;  // will do binary search in range [l, r)
    if (key_greater(ALEX_DATA_NODE_KEY_AT(m), key)) {
      int size = m;
      while (bound < size &&
             key_greater(ALEX_DATA_NODE_KEY_AT(m - bound), key)) {
        bound *= 2;
        num_exp_search_iterations_++;
      }
      l = m - std::min<int>(bound, size);
      r = m - bound / 2;
    } else {
      int size = data_capacity_ - m;
      while (bound < size &&
             key_lessequal(ALEX_DATA_NODE_KEY_AT(m + bound), key)) {
        bound *= 2;
        num_exp_search_iterations_++;
      }
      l = m + bound / 2;
      r = m + std::min<int>(bound, size);
    }
    return binary_search_upper_bound(l, r, key);
  }